

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O1

unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> __thiscall
anon_unknown.dwarf_25a9c::read_dic(anon_unknown_dwarf_25a9c *this,string *dic_name)

{
  undefined8 uVar1;
  int iVar2;
  ostream *poVar3;
  DictionarySGL<false,_false> *this_00;
  string dic_type;
  ifstream ifs;
  undefined8 local_248;
  char *local_240;
  long local_238;
  char local_230 [16];
  long local_220 [4];
  byte abStack_200 [488];
  
  std::__cxx11::string::find_last_of((char *)dic_name,0x12c4a9,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_240,(ulong)dic_name);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"read dic from ",0xe);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(dic_name->_M_dataplus)._M_p,dic_name->_M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::ifstream::ifstream(local_220,(string *)dic_name,_S_in);
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_240);
    if (iVar2 == 0) {
      this_00 = (DictionarySGL<false,_false> *)operator_new(0x18);
      ddd::DictionarySGL<false,_false>::DictionarySGL(this_00,(istream *)local_220);
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)&local_240);
      if (iVar2 == 0) {
        this_00 = (DictionarySGL<false,_false> *)operator_new(0x18);
        ddd::DictionarySGL<false,_true>::DictionarySGL
                  ((DictionarySGL<false,_true> *)this_00,(istream *)local_220);
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)&local_240);
        if (iVar2 == 0) {
          this_00 = (DictionarySGL<false,_false> *)operator_new(0x18);
          ddd::DictionarySGL<true,_false>::DictionarySGL
                    ((DictionarySGL<true,_false> *)this_00,(istream *)local_220);
        }
        else {
          iVar2 = std::__cxx11::string::compare((char *)&local_240);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)&local_240);
            if (iVar2 == 0) {
              ddd::make_unique<ddd::DictionaryMLT<false,false>,std::ifstream&>
                        ((ddd *)&local_248,
                         (basic_ifstream<char,_std::char_traits<char>_> *)local_220);
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_240);
              if (iVar2 == 0) {
                ddd::make_unique<ddd::DictionaryMLT<false,true>,std::ifstream&>
                          ((ddd *)&local_248,
                           (basic_ifstream<char,_std::char_traits<char>_> *)local_220);
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_240);
                if (iVar2 == 0) {
                  ddd::make_unique<ddd::DictionaryMLT<true,false>,std::ifstream&>
                            ((ddd *)&local_248,
                             (basic_ifstream<char,_std::char_traits<char>_> *)local_220);
                }
                else {
                  iVar2 = std::__cxx11::string::compare((char *)&local_240);
                  if (iVar2 != 0) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"invalid extension ",0x12);
                    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cerr,local_240,local_238);
                    std::endl<char,std::char_traits<char>>(poVar3);
                    goto LAB_001156f3;
                  }
                  ddd::make_unique<ddd::DictionaryMLT<true,true>,std::ifstream&>
                            ((ddd *)&local_248,
                             (basic_ifstream<char,_std::char_traits<char>_> *)local_220);
                }
              }
            }
            uVar1 = local_248;
            local_248 = 0;
            *(undefined8 *)this = uVar1;
            goto LAB_00115873;
          }
          this_00 = (DictionarySGL<false,_false> *)operator_new(0x18);
          ddd::DictionarySGL<true,_true>::DictionarySGL
                    ((DictionarySGL<true,_true> *)this_00,(istream *)local_220);
        }
      }
    }
    *(DictionarySGL<false,_false> **)this = this_00;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"failed to open ",0xf);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(dic_name->_M_dataplus)._M_p,
                        dic_name->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
LAB_001156f3:
    *(undefined8 *)this = 0;
  }
LAB_00115873:
  std::ifstream::~ifstream(local_220);
  if (local_240 != local_230) {
    operator_delete(local_240);
  }
  return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>)
         (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Dictionary> read_dic(const std::string dic_name) {
  std::string dic_type{dic_name.substr(dic_name.find_last_of(".") + 1)};

  std::cout << "read dic from " << dic_name << std::endl;
  std::ifstream ifs{dic_name};
  if (!ifs) {
    std::cerr << "failed to open " << dic_name << std::endl;
    return nullptr;
  }

  if (dic_type == "SGL") {
    return make_unique<DictionarySGL<false, false>>(ifs);
  } else if (dic_type == "SGL_NL") {
    return make_unique<DictionarySGL<false, true>>(ifs);
  } else if (dic_type == "SGL_BL") {
    return make_unique<DictionarySGL<true, false>>(ifs);
  } else if (dic_type == "SGL_NL_BL") {
    return make_unique<DictionarySGL<true, true>>(ifs);
  } else if (dic_type == "MLT") {
    return make_unique<DictionaryMLT<false, false>>(ifs);
  } else if (dic_type == "MLT_NL") {
    return make_unique<DictionaryMLT<false, true>>(ifs);
  } else if (dic_type == "MLT_BL") {
    return make_unique<DictionaryMLT<true, false>>(ifs);
  } else if (dic_type == "MLT_NL_BL") {
    return make_unique<DictionaryMLT<true, true>>(ifs);
  }

  std::cerr << "invalid extension " << dic_type << std::endl;
  return nullptr;
}